

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.hpp
# Opt level: O3

packer<msgpack::v1::sbuffer> * __thiscall
msgpack::v1::adaptor::pack<std::tuple<int&&,char_const*&&>,void>::operator()
          (void *this,packer<msgpack::v1::sbuffer> *o,tuple<int_&&,_const_char_*&&> *v)

{
  size_t in_RCX;
  char d;
  undefined1 local_12;
  undefined1 local_11;
  
  sbuffer::write(o->m_stream,(int)&local_12,(void *)0x1,in_RCX);
  packer<msgpack::v1::sbuffer>::pack_imp_int32<int>
            (o,*(v->super__Tuple_impl<0UL,_int_&&,_const_char_*&&>).
                super__Head_base<0UL,_int_&&,_false>._M_head_impl);
  pack<char_const*,void>::operator()
            (&local_11,o,
             *(v->super__Tuple_impl<0UL,_int_&&,_const_char_*&&>).
              super__Tuple_impl<1UL,_const_char_*&&>.super__Head_base<1UL,_const_char_*&&,_false>.
              _M_head_impl);
  return o;
}

Assistant:

msgpack::packer<Stream>& operator()(
        msgpack::packer<Stream>& o,
        const std::tuple<Args...>& v) const {
        uint32_t size = checked_get_container_size(sizeof...(Args));
        o.pack_array(size);
        StdTuplePacker<Stream, decltype(v), sizeof...(Args)>::pack(o, v);
        return o;
    }